

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlNodeAddContentLen(xmlNodePtr cur,xmlChar *content,int len)

{
  xmlElementType xVar1;
  xmlDictPtr dict;
  xmlNodePtr first;
  int iVar2;
  xmlChar *pxVar3;
  xmlNodePtr cur_00;
  xmlNodePtr pxVar4;
  
  if (len < 1 || cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar1 = cur->type;
  if (XML_NOTATION_NODE < xVar1) {
    return;
  }
  if ((0x11f8U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
    if ((0x802U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      return;
    }
    first = cur->last;
    cur_00 = xmlNewDocTextLen(cur->doc,content,len);
    if (cur_00 == (xmlNodePtr)0x0) {
      return;
    }
    pxVar4 = xmlAddChild(cur,cur_00);
    if (first == (xmlNodePtr)0x0 || pxVar4 != cur_00) {
      return;
    }
    if (first->next != cur_00) {
      return;
    }
    xmlTextMerge(first,cur_00);
    return;
  }
  if (content == (xmlChar *)0x0) {
    return;
  }
  pxVar3 = cur->content;
  if ((_xmlAttr **)pxVar3 == &cur->properties) {
LAB_00182506:
    pxVar3 = xmlStrncatNew(pxVar3,content,len);
    cur->content = pxVar3;
    cur->properties = (_xmlAttr *)0x0;
  }
  else {
    if ((cur->doc != (_xmlDoc *)0x0) && (dict = cur->doc->dict, dict != (xmlDictPtr)0x0)) {
      iVar2 = xmlDictOwns(dict,pxVar3);
      pxVar3 = cur->content;
      if (iVar2 != 0) goto LAB_00182506;
    }
    pxVar3 = xmlStrncat(pxVar3,content,len);
    cur->content = pxVar3;
  }
  return;
}

Assistant:

void
xmlNodeAddContentLen(xmlNodePtr cur, const xmlChar *content, int len) {
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNodeAddContentLen : node == NULL\n");
#endif
	return;
    }
    if (len <= 0) return;
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE: {
	    xmlNodePtr last, newNode, tmp;

	    last = cur->last;
	    newNode = xmlNewDocTextLen(cur->doc, content, len);
	    if (newNode != NULL) {
		tmp = xmlAddChild(cur, newNode);
		if (tmp != newNode)
		    return;
	        if ((last != NULL) && (last->next == newNode)) {
		    xmlTextMerge(last, newNode);
		}
	    }
	    break;
	}
        case XML_ATTRIBUTE_NODE:
	    break;
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_NOTATION_NODE:
	    if (content != NULL) {
	        if ((cur->content == (xmlChar *) &(cur->properties)) ||
		    ((cur->doc != NULL) && (cur->doc->dict != NULL) &&
			    xmlDictOwns(cur->doc->dict, cur->content))) {
		    cur->content = xmlStrncatNew(cur->content, content, len);
		    cur->properties = NULL;
		} else {
		    cur->content = xmlStrncat(cur->content, content, len);
                }
            }
	    break;
        case XML_DOCUMENT_NODE:
        case XML_DTD_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    break;
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
	    break;
    }
}